

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O0

bool leveldb::ParseFileName(string *fname,uint64_t *number,FileType *type)

{
  bool bVar1;
  bool local_ea;
  bool local_e9;
  Slice local_e8;
  Slice local_d8;
  Slice local_c8;
  Slice local_b8;
  undefined1 local_a8 [8];
  Slice suffix;
  uint64_t num_1;
  uint64_t num;
  Slice local_78;
  Slice local_68;
  Slice local_58;
  Slice local_48;
  undefined1 local_38 [8];
  Slice rest;
  FileType *type_local;
  uint64_t *number_local;
  string *fname_local;
  
  rest.size_ = (size_t)type;
  Slice::Slice((Slice *)local_38,fname);
  Slice::Slice(&local_48,"CURRENT");
  bVar1 = operator==((Slice *)local_38,&local_48);
  if (bVar1) {
    *number = 0;
    *(undefined4 *)rest.size_ = 4;
  }
  else {
    Slice::Slice(&local_58,"LOCK");
    bVar1 = operator==((Slice *)local_38,&local_58);
    if (bVar1) {
      *number = 0;
      *(undefined4 *)rest.size_ = 1;
    }
    else {
      Slice::Slice(&local_68,"LOG");
      bVar1 = operator==((Slice *)local_38,&local_68);
      local_e9 = true;
      if (!bVar1) {
        Slice::Slice(&local_78,"LOG.old");
        local_e9 = operator==((Slice *)local_38,&local_78);
      }
      if (local_e9 == false) {
        Slice::Slice((Slice *)&num,"MANIFEST-");
        bVar1 = Slice::starts_with((Slice *)local_38,(Slice *)&num);
        if (bVar1) {
          Slice::remove_prefix((Slice *)local_38,9);
          bVar1 = ConsumeDecimalNumber((Slice *)local_38,&num_1);
          if (!bVar1) {
            return false;
          }
          bVar1 = Slice::empty((Slice *)local_38);
          if (!bVar1) {
            return false;
          }
          *(undefined4 *)rest.size_ = 3;
          *number = num_1;
        }
        else {
          bVar1 = ConsumeDecimalNumber((Slice *)local_38,&suffix.size_);
          if (!bVar1) {
            return false;
          }
          local_a8 = local_38;
          suffix.data_ = rest.data_;
          Slice::Slice(&local_b8,".log");
          bVar1 = operator==((Slice *)local_a8,&local_b8);
          if (bVar1) {
            *(undefined4 *)rest.size_ = 0;
          }
          else {
            Slice::Slice(&local_c8,".sst");
            bVar1 = operator==((Slice *)local_a8,&local_c8);
            local_ea = true;
            if (!bVar1) {
              Slice::Slice(&local_d8,".ldb");
              local_ea = operator==((Slice *)local_a8,&local_d8);
            }
            if (local_ea == false) {
              Slice::Slice(&local_e8,".dbtmp");
              bVar1 = operator==((Slice *)local_a8,&local_e8);
              if (!bVar1) {
                return false;
              }
              *(undefined4 *)rest.size_ = 5;
            }
            else {
              *(undefined4 *)rest.size_ = 2;
            }
          }
          *number = suffix.size_;
        }
      }
      else {
        *number = 0;
        *(undefined4 *)rest.size_ = 6;
      }
    }
  }
  return true;
}

Assistant:

bool ParseFileName(const std::string &fname,
                       uint64_t *number,
                       FileType *type) {
        Slice rest(fname);
        if (rest == "CURRENT") {
            *number = 0;
            *type = kCurrentFile;
        } else if (rest == "LOCK") {
            *number = 0;
            *type = kDBLockFile;
        } else if (rest == "LOG" || rest == "LOG.old") {
            *number = 0;
            *type = kInfoLogFile;
        } else if (rest.starts_with("MANIFEST-")) {
            rest.remove_prefix(strlen("MANIFEST-"));
            uint64_t num;
            if (!ConsumeDecimalNumber(&rest, &num)) {
                return false;
            }
            if (!rest.empty()) {
                return false;
            }
            *type = kDescriptorFile;
            *number = num;
        } else {
            // Avoid strtoull() to keep filename format independent of the
            // current locale
            uint64_t num;
            if (!ConsumeDecimalNumber(&rest, &num)) {
                return false;
            }
            Slice suffix = rest;
            if (suffix == Slice(".log")) {
                *type = kLogFile;
            } else if (suffix == Slice(".sst") || suffix == Slice(".ldb")) {
                *type = kTableFile;
            } else if (suffix == Slice(".dbtmp")) {
                *type = kTempFile;
            } else {
                return false;
            }
            *number = num;
        }
        return true;
    }